

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

Span<int> __thiscall
Potassco::SmodelsConvert::SmData::mapLits<int>
          (SmData *this,Span<int> *in,vector<int,_std::allocator<int>_> *out)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *in_RDX;
  Span<int> *in_RSI;
  SmData *in_RDI;
  Span<int> SVar2;
  iterator x;
  value_type_conflict2 *in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  int *piVar3;
  int *local_30;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x11e547);
  local_30 = begin<int>(in_RSI);
  while( true ) {
    piVar3 = local_30;
    piVar1 = end<int>((Span<int> *)0x11e56a);
    if (piVar3 == piVar1) break;
    in_stack_ffffffffffffffb0 = in_RDX;
    mapLit(in_RDI,(Lit_t)((ulong)piVar3 >> 0x20));
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_30 = local_30 + 1;
  }
  SVar2 = toSpan<std::vector<int,std::allocator<int>>>(in_stack_ffffffffffffffb0);
  return SVar2;
}

Assistant:

Span<T>  mapLits(const Span<T>& in, std::vector<T>& out) {
		out.clear();
		for (typename Span<T>::iterator x = begin(in); x != end(in); ++x) { out.push_back(mapLit(*x)); }
		return toSpan(out);
	}